

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeCommit(sqlite3 *db,Vdbe *p)

{
  int *piVar1;
  char *pcVar2;
  u8 uVar3;
  VTable **ppVVar4;
  sqlite3_vtab *psVar5;
  _func_int_sqlite3_vtab_ptr *p_Var6;
  Btree *pBVar7;
  sqlite3_mutex *psVar8;
  Pager *pPVar9;
  BtShared *pBVar10;
  char *pcVar11;
  bool bVar12;
  long lVar13;
  sqlite3_file *psVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  BtShared *pBt;
  sqlite3_vfs *pVfs;
  bool bVar23;
  sqlite3_file *pMaster;
  u32 iRandom;
  int res;
  sqlite3_file *local_60;
  sqlite3_file *local_58;
  long local_50;
  int local_44;
  uint local_40;
  int local_3c;
  sqlite3_vfs *local_38;
  
  ppVVar4 = db->aVTrans;
  db->aVTrans = (VTable **)0x0;
  if (db->nVTrans < 1) {
    iVar15 = 0;
  }
  else {
    lVar21 = 0;
    do {
      psVar5 = ppVVar4[lVar21]->pVtab;
      iVar15 = 0;
      if ((psVar5 != (sqlite3_vtab *)0x0) &&
         (p_Var6 = psVar5->pModule->xSync, p_Var6 != (_func_int_sqlite3_vtab_ptr *)0x0)) {
        iVar15 = (*p_Var6)(psVar5);
        sqlite3DbFree(db,p->zErrMsg);
        pcVar18 = sqlite3DbStrDup(db,psVar5->zErrMsg);
        p->zErrMsg = pcVar18;
        sqlite3_free(psVar5->zErrMsg);
      }
    } while ((iVar15 == 0) && (lVar21 = lVar21 + 1, lVar21 < db->nVTrans));
  }
  db->aVTrans = ppVVar4;
  if (iVar15 == 0) {
    lVar21 = 0;
    lVar22 = 8;
    iVar15 = 0;
    bVar23 = false;
    while (lVar21 < db->nDb) {
      pBVar7 = *(Btree **)((long)&db->aDb->zName + lVar22);
      iVar19 = 0;
      if ((pBVar7 != (Btree *)0x0) && (pBVar7->inTrans == '\x02')) {
        iVar15 = iVar15 + (uint)(lVar21 != 1);
        sqlite3BtreeEnter(pBVar7);
        iVar19 = sqlite3PagerExclusiveLock(pBVar7->pBt->pPager);
        bVar23 = true;
        if (pBVar7->sharable != '\0') {
          piVar1 = &pBVar7->wantToLock;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            psVar8 = pBVar7->pBt->mutex;
            if (psVar8 != (sqlite3_mutex *)0x0) {
              (*sqlite3Config.mutex.xMutexLeave)(psVar8);
            }
            bVar23 = true;
            pBVar7->locked = '\0';
          }
        }
      }
      lVar21 = lVar21 + 1;
      lVar22 = lVar22 + 0x20;
      if (iVar19 != 0) {
        return iVar19;
      }
    }
    if (((bVar23) && (db->xCommitCallback != (_func_int_void_ptr *)0x0)) &&
       (iVar19 = (*db->xCommitCallback)(db->pCommitArg), iVar19 != 0)) {
      return 0x213;
    }
    pPVar9 = db->aDb->pBt->pBt->pPager;
    if (pPVar9->memDb == '\0') {
      pcVar18 = pPVar9->zFilename;
    }
    else {
      pcVar18 = "";
    }
    if (pcVar18 == (char *)0x0) {
      bVar23 = true;
    }
    else {
      uVar20 = 0xffffffffffffffff;
      do {
        lVar21 = uVar20 + 1;
        uVar20 = uVar20 + 1;
      } while (pcVar18[lVar21] != '\0');
      bVar23 = (uVar20 & 0x3fffffff) == 0;
    }
    if ((bVar23) || (iVar15 < 2)) {
      if (db->nDb < 1) {
        iVar15 = 0;
      }
      else {
        lVar21 = 8;
        lVar22 = 0;
        do {
          pBVar7 = *(Btree **)((long)&db->aDb->zName + lVar21);
          iVar15 = 0;
          if (pBVar7 != (Btree *)0x0) {
            iVar15 = sqlite3BtreeCommitPhaseOne(pBVar7,(char *)0x0);
          }
          if (iVar15 != 0) break;
          lVar22 = lVar22 + 1;
          lVar21 = lVar21 + 0x20;
        } while (lVar22 < db->nDb);
      }
      if (iVar15 != 0) {
        return iVar15;
      }
      lVar21 = -1;
      lVar22 = 8;
      while (lVar21 = lVar21 + 1, lVar21 < db->nDb) {
        pBVar7 = *(Btree **)((long)&db->aDb->zName + lVar22);
        if (pBVar7 == (Btree *)0x0) {
          iVar15 = 0;
        }
        else {
          iVar15 = sqlite3BtreeCommitPhaseTwo(pBVar7,0);
        }
        lVar22 = lVar22 + 0x20;
        if (iVar15 != 0) {
          return iVar15;
        }
      }
    }
    else {
      if (pPVar9->memDb == '\0') {
        pcVar18 = pPVar9->zFilename;
      }
      else {
        pcVar18 = "";
      }
      pVfs = db->pVfs;
      local_60 = (sqlite3_file *)0x0;
      if (pcVar18 == (char *)0x0) {
        uVar20 = 0;
      }
      else {
        lVar21 = -1;
        do {
          lVar22 = lVar21 + 1;
          lVar21 = lVar21 + 1;
        } while (pcVar18[lVar22] != '\0');
        uVar20 = (ulong)((uint)lVar21 & 0x3fffffff);
      }
      pcVar18 = sqlite3MPrintf(db,"%s-mjXXXXXX9XXz");
      if (pcVar18 == (char *)0x0) {
        return 7;
      }
      iVar15 = 0;
      do {
        if (iVar15 == 0) {
LAB_00135f79:
          iVar15 = iVar15 + 1;
          sqlite3_randomness(4,&local_40);
          sqlite3_snprintf(0xd,pcVar18 + uVar20,"-mj%06X9%02X",(ulong)(local_40 >> 8));
          iVar19 = (*pVfs->xAccess)(pVfs,pcVar18,0,&local_3c);
          bVar23 = true;
        }
        else {
          if (iVar15 < 0x65) {
            if (iVar15 == 1) {
              sqlite3_log(0xd,"MJ collide: %s",pcVar18);
            }
            goto LAB_00135f79;
          }
          bVar23 = false;
          sqlite3_log(0xd,"MJ delete: %s",pcVar18);
          (*pVfs->xDelete)(pVfs,pcVar18,0);
          iVar19 = 0;
        }
      } while (((bVar23) && (iVar19 == 0)) && (local_3c != 0));
      if (iVar19 == 0) {
        iVar19 = sqlite3OsOpenMalloc(pVfs,pcVar18,&local_60,0x4016,(int *)0x0);
      }
      if (iVar19 != 0) {
LAB_00136002:
        sqlite3DbFree(db,pcVar18);
        return iVar19;
      }
      if (db->nDb < 1) {
        iVar19 = 0;
        bVar23 = true;
      }
      else {
        lVar21 = 0;
        local_58 = local_60;
        iVar19 = 0;
        local_50 = 0;
        bVar23 = false;
        local_38 = pVfs;
        do {
          pBVar7 = db->aDb[lVar21].pBt;
          if ((pBVar7 == (Btree *)0x0) || (pBVar7->inTrans != '\x02')) {
            iVar16 = 0;
            iVar15 = iVar19;
          }
          else {
            pBVar10 = pBVar7->pBt;
            pcVar11 = pBVar10->pPager->zJournal;
            if (pcVar11 == (char *)0x0) {
              iVar16 = 0xf;
              pVfs = local_38;
              iVar15 = local_44;
            }
            else {
              bVar12 = !bVar23;
              bVar23 = true;
              if (bVar12) {
                sqlite3BtreeEnter(pBVar7);
                uVar3 = pBVar10->pPager->noSync;
                if (pBVar7->sharable != '\0') {
                  piVar1 = &pBVar7->wantToLock;
                  *piVar1 = *piVar1 + -1;
                  if (*piVar1 == 0) {
                    psVar8 = pBVar7->pBt->mutex;
                    if (psVar8 != (sqlite3_mutex *)0x0) {
                      (*sqlite3Config.mutex.xMutexLeave)(psVar8);
                    }
                    pBVar7->locked = '\0';
                  }
                }
                bVar23 = uVar3 == '\0';
              }
              lVar22 = 0;
              do {
                pcVar2 = pcVar11 + lVar22;
                lVar22 = lVar22 + 1;
              } while (*pcVar2 != '\0');
              iVar19 = (*local_58->pMethods->xWrite)
                                 (local_58,pcVar11,((int)lVar22 - 1U & 0x3fffffff) + 1,local_50);
              pVfs = local_38;
              lVar22 = -1;
              do {
                lVar13 = lVar22 + 1;
                lVar22 = lVar22 + 1;
              } while (pcVar11[lVar13] != '\0');
              local_50 = local_50 + (ulong)((uint)lVar22 & 0x3fffffff) + 1;
              if (iVar19 == 0) {
                iVar19 = 0;
                iVar16 = 0;
                iVar15 = iVar19;
              }
              else {
                if (local_58->pMethods != (sqlite3_io_methods *)0x0) {
                  (*local_58->pMethods->xClose)(local_58);
                  local_58->pMethods = (sqlite3_io_methods *)0x0;
                }
                sqlite3_free(local_58);
                (*pVfs->xDelete)(pVfs,pcVar18,0);
                sqlite3DbFree(db,pcVar18);
                iVar16 = 1;
                iVar15 = iVar19;
                local_44 = iVar19;
              }
            }
          }
          if ((iVar16 != 0xf) && (iVar16 != 0)) {
            return iVar15;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < db->nDb);
        bVar23 = !bVar23;
      }
      psVar14 = local_60;
      if ((!bVar23) &&
         (uVar17 = (*local_60->pMethods->xDeviceCharacteristics)(local_60), (uVar17 >> 10 & 1) == 0)
         ) {
        iVar19 = (*psVar14->pMethods->xSync)(psVar14,2);
        if (iVar19 != 0) {
          if (psVar14->pMethods != (sqlite3_io_methods *)0x0) {
            (*psVar14->pMethods->xClose)(psVar14);
            psVar14->pMethods = (sqlite3_io_methods *)0x0;
          }
          sqlite3_free(psVar14);
          (*pVfs->xDelete)(pVfs,pcVar18,0);
          goto LAB_00136002;
        }
        iVar19 = 0;
      }
      bVar23 = iVar19 == 0;
      if ((bVar23) && (0 < db->nDb)) {
        lVar21 = 8;
        lVar22 = 0;
        do {
          pBVar7 = *(Btree **)((long)&db->aDb->zName + lVar21);
          iVar19 = 0;
          if (pBVar7 != (Btree *)0x0) {
            iVar19 = sqlite3BtreeCommitPhaseOne(pBVar7,pcVar18);
          }
          bVar23 = iVar19 == 0;
          if (!bVar23) break;
          lVar22 = lVar22 + 1;
          lVar21 = lVar21 + 0x20;
        } while (lVar22 < db->nDb);
      }
      psVar14 = local_60;
      if (local_60->pMethods != (sqlite3_io_methods *)0x0) {
        (*local_60->pMethods->xClose)(local_60);
        psVar14->pMethods = (sqlite3_io_methods *)0x0;
      }
      sqlite3_free(psVar14);
      if (!bVar23) goto LAB_00136002;
      iVar15 = (*pVfs->xDelete)(pVfs,pcVar18,1);
      sqlite3DbFree(db,pcVar18);
      if (iVar15 != 0) {
        return iVar15;
      }
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      if (0 < db->nDb) {
        lVar21 = 8;
        lVar22 = 0;
        do {
          pBVar7 = *(Btree **)((long)&db->aDb->zName + lVar21);
          if (pBVar7 != (Btree *)0x0) {
            sqlite3BtreeCommitPhaseTwo(pBVar7,1);
          }
          lVar22 = lVar22 + 1;
          lVar21 = lVar21 + 0x20;
        } while (lVar22 < db->nDb);
      }
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
    }
    callFinaliser(db,0x80);
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

static int vdbeCommit(sqlite3 *db, Vdbe *p){
  int i;
  int nTrans = 0;  /* Number of databases with an active write-transaction */
  int rc = SQLITE_OK;
  int needXcommit = 0;

#ifdef SQLITE_OMIT_VIRTUALTABLE
  /* With this option, sqlite3VtabSync() is defined to be simply 
  ** SQLITE_OK so p is not used. 
  */
  UNUSED_PARAMETER(p);
#endif

  /* Before doing anything else, call the xSync() callback for any
  ** virtual module tables written in this transaction. This has to
  ** be done before determining whether a master journal file is 
  ** required, as an xSync() callback may add an attached database
  ** to the transaction.
  */
  rc = sqlite3VtabSync(db, &p->zErrMsg);

  /* This loop determines (a) if the commit hook should be invoked and
  ** (b) how many database files have open write transactions, not 
  ** including the temp database. (b) is important because if more than 
  ** one database file has an open write transaction, a master journal
  ** file is required for an atomic commit.
  */ 
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){ 
    Btree *pBt = db->aDb[i].pBt;
    if( sqlite3BtreeIsInTrans(pBt) ){
      needXcommit = 1;
      if( i!=1 ) nTrans++;
      sqlite3BtreeEnter(pBt);
      rc = sqlite3PagerExclusiveLock(sqlite3BtreePager(pBt));
      sqlite3BtreeLeave(pBt);
    }
  }
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* If there are any write-transactions at all, invoke the commit hook */
  if( needXcommit && db->xCommitCallback ){
    rc = db->xCommitCallback(db->pCommitArg);
    if( rc ){
      return SQLITE_CONSTRAINT_COMMITHOOK;
    }
  }

  /* The simple case - no more than one database file (not counting the
  ** TEMP database) has a transaction active.   There is no need for the
  ** master-journal.
  **
  ** If the return value of sqlite3BtreeGetFilename() is a zero length
  ** string, it means the main database is :memory: or a temp file.  In 
  ** that case we do not support atomic multi-file commits, so use the 
  ** simple case then too.
  */
  if( 0==sqlite3Strlen30(sqlite3BtreeGetFilename(db->aDb[0].pBt))
   || nTrans<=1
  ){
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, 0);
      }
    }

    /* Do the commit only if all databases successfully complete phase 1. 
    ** If one of the BtreeCommitPhaseOne() calls fails, this indicates an
    ** IO error while deleting or truncating a journal file. It is unlikely,
    ** but could happen. In this case abandon processing and return the error.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseTwo(pBt, 0);
      }
    }
    if( rc==SQLITE_OK ){
      sqlite3VtabCommit(db);
    }
  }

  /* The complex case - There is a multi-file write-transaction active.
  ** This requires a master journal file to ensure the transaction is
  ** committed atomicly.
  */
#ifndef SQLITE_OMIT_DISKIO
  else{
    sqlite3_vfs *pVfs = db->pVfs;
    int needSync = 0;
    char *zMaster = 0;   /* File-name for the master journal */
    char const *zMainFile = sqlite3BtreeGetFilename(db->aDb[0].pBt);
    sqlite3_file *pMaster = 0;
    i64 offset = 0;
    int res;
    int retryCount = 0;
    int nMainFile;

    /* Select a master journal file name */
    nMainFile = sqlite3Strlen30(zMainFile);
    zMaster = sqlite3MPrintf(db, "%s-mjXXXXXX9XXz", zMainFile);
    if( zMaster==0 ) return SQLITE_NOMEM;
    do {
      u32 iRandom;
      if( retryCount ){
        if( retryCount>100 ){
          sqlite3_log(SQLITE_FULL, "MJ delete: %s", zMaster);
          sqlite3OsDelete(pVfs, zMaster, 0);
          break;
        }else if( retryCount==1 ){
          sqlite3_log(SQLITE_FULL, "MJ collide: %s", zMaster);
        }
      }
      retryCount++;
      sqlite3_randomness(sizeof(iRandom), &iRandom);
      sqlite3_snprintf(13, &zMaster[nMainFile], "-mj%06X9%02X",
                               (iRandom>>8)&0xffffff, iRandom&0xff);
      /* The antipenultimate character of the master journal name must
      ** be "9" to avoid name collisions when using 8+3 filenames. */
      assert( zMaster[sqlite3Strlen30(zMaster)-3]=='9' );
      sqlite3FileSuffix3(zMainFile, zMaster);
      rc = sqlite3OsAccess(pVfs, zMaster, SQLITE_ACCESS_EXISTS, &res);
    }while( rc==SQLITE_OK && res );
    if( rc==SQLITE_OK ){
      /* Open the master journal. */
      rc = sqlite3OsOpenMalloc(pVfs, zMaster, &pMaster, 
          SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE|
          SQLITE_OPEN_EXCLUSIVE|SQLITE_OPEN_MASTER_JOURNAL, 0
      );
    }
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zMaster);
      return rc;
    }
 
    /* Write the name of each database file in the transaction into the new
    ** master journal file. If an error occurs at this point close
    ** and delete the master journal file. All the individual journal files
    ** still have 'null' as the master journal pointer, so they will roll
    ** back independently if a failure occurs.
    */
    for(i=0; i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( sqlite3BtreeIsInTrans(pBt) ){
        char const *zFile = sqlite3BtreeGetJournalname(pBt);
        if( zFile==0 ){
          continue;  /* Ignore TEMP and :memory: databases */
        }
        assert( zFile[0]!=0 );
        if( !needSync && !sqlite3BtreeSyncDisabled(pBt) ){
          needSync = 1;
        }
        rc = sqlite3OsWrite(pMaster, zFile, sqlite3Strlen30(zFile)+1, offset);
        offset += sqlite3Strlen30(zFile)+1;
        if( rc!=SQLITE_OK ){
          sqlite3OsCloseFree(pMaster);
          sqlite3OsDelete(pVfs, zMaster, 0);
          sqlite3DbFree(db, zMaster);
          return rc;
        }
      }
    }

    /* Sync the master journal file. If the IOCAP_SEQUENTIAL device
    ** flag is set this is not required.
    */
    if( needSync 
     && 0==(sqlite3OsDeviceCharacteristics(pMaster)&SQLITE_IOCAP_SEQUENTIAL)
     && SQLITE_OK!=(rc = sqlite3OsSync(pMaster, SQLITE_SYNC_NORMAL))
    ){
      sqlite3OsCloseFree(pMaster);
      sqlite3OsDelete(pVfs, zMaster, 0);
      sqlite3DbFree(db, zMaster);
      return rc;
    }

    /* Sync all the db files involved in the transaction. The same call
    ** sets the master journal pointer in each individual journal. If
    ** an error occurs here, do not delete the master journal file.
    **
    ** If the error occurs during the first call to
    ** sqlite3BtreeCommitPhaseOne(), then there is a chance that the
    ** master journal file will be orphaned. But we cannot delete it,
    ** in case the master journal file name was written into the journal
    ** file before the failure occurred.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){ 
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, zMaster);
      }
    }
    sqlite3OsCloseFree(pMaster);
    assert( rc!=SQLITE_BUSY );
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zMaster);
      return rc;
    }

    /* Delete the master journal file. This commits the transaction. After
    ** doing this the directory is synced again before any individual
    ** transaction files are deleted.
    */
    rc = sqlite3OsDelete(pVfs, zMaster, 1);
    sqlite3DbFree(db, zMaster);
    zMaster = 0;
    if( rc ){
      return rc;
    }

    /* All files and directories have already been synced, so the following
    ** calls to sqlite3BtreeCommitPhaseTwo() are only closing files and
    ** deleting or truncating journals. If something goes wrong while
    ** this is happening we don't really care. The integrity of the
    ** transaction is already guaranteed, but some stray 'cold' journals
    ** may be lying around. Returning an error code won't help matters.
    */
    disable_simulated_io_errors();
    sqlite3BeginBenignMalloc();
    for(i=0; i<db->nDb; i++){ 
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        sqlite3BtreeCommitPhaseTwo(pBt, 1);
      }
    }
    sqlite3EndBenignMalloc();
    enable_simulated_io_errors();

    sqlite3VtabCommit(db);
  }
#endif

  return rc;
}